

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

int __thiscall
CVmObjFile::getp_set_pos_end(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  
  if (getp_set_pos_end(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_set_pos_end();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_set_pos_end::desc);
  if (iVar2 == 0) {
    check_valid_file(this);
    pcVar3 = (this->super_CVmObject).ext_;
    if (*(long *)(pcVar3 + 0x20) != 0) {
      *(undefined8 *)(*(long *)(pcVar3 + 0x20) + 8) = 0;
      pcVar3 = (this->super_CVmObject).ext_;
    }
    pcVar3[0x18] = pcVar3[0x18] & 0xfd;
    plVar1 = *(long **)((this->super_CVmObject).ext_ + 8);
    (**(code **)(*plVar1 + 0x40))(plVar1,0,2);
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_set_pos_end(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* note the seeking operation */
    note_file_seek(vmg_ TRUE);

    /* seek to the end position */
    get_ext()->fp->seek(0, OSFSK_END);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}